

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

nh_bool get_option_value(win_menu *mdat,wchar_t idx)

{
  undefined4 uVar1;
  nh_listitem *pnVar2;
  nh_autopickup_rules *pnVar3;
  char cVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  long *plVar8;
  void *pvVar9;
  wchar_t *pwVar10;
  nh_menuitem_conflict *pnVar11;
  nh_menuitem_conflict *pnVar12;
  uint uVar13;
  ulong uVar14;
  char **ppcVar15;
  undefined8 *puVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  nh_menuitem_conflict *pnVar22;
  int iVar23;
  char *pcVar24;
  char *pcVar25;
  ulong uVar26;
  char *pcVar27;
  ulong uVar28;
  nh_option_desc *pnVar29;
  size_t sVar30;
  long lVar31;
  nh_menuitem *_item_;
  long lVar32;
  bool bVar33;
  char cVar34;
  byte bVar35;
  wchar_t selected [1];
  nh_optvalue value;
  wchar_t selected_1 [1];
  wchar_t selected_2 [1];
  nh_menuitem *_item__5;
  nh_menuitem *_item__2;
  char query [256];
  char buf_1 [256];
  char query_2 [256];
  char strbuf [256];
  char buf [256];
  wchar_t local_1efc;
  nh_menuitem_conflict *local_1ef8;
  nh_option_desc *local_1ef0;
  nh_menuitem_conflict *local_1ee8;
  char *local_1ee0;
  wchar_t local_1ed8;
  wchar_t local_1ed4;
  char *local_1ed0;
  char *local_1ec8;
  char *local_1ec0;
  nh_menuitem_conflict *local_1eb8;
  long local_1eb0;
  ulong local_1ea8;
  char *local_1ea0;
  wchar_t local_1e94;
  long local_1e90;
  char *local_1e88;
  nh_menuitem_conflict *local_1e80;
  char *local_1e78;
  char *local_1e70;
  ulong local_1e68;
  char acStack_1e60 [248];
  char local_1d68 [4];
  undefined2 auStack_1d64 [2];
  undefined4 auStack_1d60 [62];
  char local_1c68 [256];
  char local_1b68 [256];
  nh_menuitem_conflict local_1a68 [25];
  
  iVar5 = settings.optstyle;
  bVar35 = 0;
  lVar19 = (long)idx * 0x10c;
  wVar7 = mdat->items[idx].id;
  iVar23 = wVar7 >> 10;
  if (3 < iVar23 - 1U) {
    return '\0';
  }
  switch(iVar23) {
  case 2:
    break;
  case 3:
    break;
  case 4:
    pnVar29 = curses_options;
    goto LAB_0010fe21;
  }
  pnVar29 = (nh_option_desc *)nh_get_options();
LAB_0010fe21:
  uVar17 = (ulong)(uint)((wVar7 & 0x1ffU) * 0x30);
  local_1ee0 = local_1b68;
  uVar18 = *(uint *)((long)&pnVar29->type + uVar17);
  if (5 < uVar18) {
    if (uVar18 != 1000) {
      return '\0';
    }
    show_keymap_menu('\0');
    return '\0';
  }
  pnVar29 = (nh_option_desc *)((long)&pnVar29->name + uVar17);
  local_1ef0 = pnVar29;
  switch(uVar18) {
  case 0:
    local_1ee8 = (nh_menuitem_conflict *)CONCAT44(local_1ee8._4_4_,iVar5);
    local_1ef8 = (nh_menuitem_conflict *)lVar19;
    pnVar11 = (nh_menuitem_conflict *)malloc(0x430);
    pnVar11->id = L'\0';
    pnVar11->role = MI_TEXT;
    pnVar11->accel = '\0';
    pnVar11->group_accel = '\0';
    pnVar11->selected = '\0';
    strcpy(pnVar11->caption,pnVar29->helptxt);
    pnVar11[1].accel = '\0';
    pnVar11[1].group_accel = '\0';
    pnVar11[1].selected = '\0';
    pnVar11[1].id = L'\0';
    pnVar11[1].role = MI_TEXT;
    pnVar11[1].caption[0] = '\0';
    pnVar11[2].id = L'\x01';
    pnVar11[2].role = MI_NORMAL;
    pnVar11[2].accel = 't';
    pnVar11[2].group_accel = '\0';
    pnVar11[2].selected = '\0';
    bVar33 = (pnVar29->value).b == '\0';
    pcVar27 = "true (set)";
    if (bVar33) {
      pcVar27 = "true";
    }
    pcVar24 = "false";
    if (bVar33) {
      pcVar24 = "false (set)";
    }
    strcpy(pnVar11[2].caption,pcVar27);
    pnVar11[3].id = L'\x02';
    pnVar11[3].role = MI_NORMAL;
    pnVar11[3].accel = 'f';
    pnVar11[3].group_accel = '\0';
    pnVar11[3].selected = '\0';
    strcpy(pnVar11[3].caption,pcVar24);
    wVar7 = curses_display_menu(pnVar11,L'\x04',pnVar29->name,L'\x01',&local_1a68[0].id);
    free(pnVar11);
    local_1ee0 = (char *)CONCAT71(local_1ee0._1_7_,(pnVar29->value).b);
    if (wVar7 == L'\x01') {
      local_1ee0 = (char *)CONCAT71(local_1ee0._1_7_,local_1a68[0].id == L'\x01');
    }
    break;
  case 1:
    local_1ef8 = (nh_menuitem_conflict *)lVar19;
    sprintf((char *)&local_1e68,"New value for %s (number from %d to %d)",pnVar29->name,
            (ulong)(uint)(pnVar29->field_4).i.min,(ulong)(uint)(pnVar29->field_4).i.max);
    sprintf((char *)local_1a68,"%d",(ulong)local_1ee0 & 0xffffffff);
    curses_getline((char *)&local_1e68,(char *)local_1a68);
    if ((char)local_1a68[0].id == '\x1b') {
      return '\0';
    }
    __isoc99_sscanf(local_1a68,"%d",&local_1ee0);
    goto LAB_00110e81;
  case 2:
    local_1ee8 = (nh_menuitem_conflict *)CONCAT44(local_1ee8._4_4_,iVar5);
    local_1ef8 = (nh_menuitem_conflict *)lVar19;
    pnVar11 = (nh_menuitem_conflict *)malloc(0xa78);
    pnVar11->id = L'\0';
    pnVar11->role = MI_TEXT;
    pnVar11->accel = '\0';
    pnVar11->group_accel = '\0';
    pnVar11->selected = '\0';
    strcpy(pnVar11->caption,pnVar29->helptxt);
    pnVar11[1].accel = '\0';
    pnVar11[1].group_accel = '\0';
    pnVar11[1].selected = '\0';
    pnVar11[1].id = L'\0';
    pnVar11[1].role = MI_TEXT;
    pnVar11[1].caption[0] = '\0';
    if ((pnVar29->field_4).e.numchoices < 1) {
      uVar17 = 2;
    }
    else {
      iVar5 = 10;
      uVar17 = 2;
      lVar31 = 8;
      lVar19 = 0x322;
      do {
        pnVar2 = (pnVar29->field_4).e.choices;
        pnVar12 = *(nh_menuitem_conflict **)((long)&pnVar2->id + lVar31);
        if ((pnVar29->value).i == *(int *)((long)pnVar2 + lVar31 + -8)) {
          snprintf((char *)local_1a68,0x80,"%s (set)",pnVar12);
          pnVar12 = local_1a68;
        }
        if ((long)iVar5 <= (long)uVar17) {
          iVar5 = iVar5 * 2;
          pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)iVar5 * 0x10c);
        }
        lVar32 = uVar17 - 1;
        pcVar27 = pnVar11->caption + lVar19 + -8;
        *(int *)(pcVar27 + -0x10a) = (int)lVar32;
        *(undefined4 *)(pcVar27 + -0x106) = 1;
        *(undefined2 *)(pcVar27 + -2) = MI_TEXT >> 0x10;
        *pcVar27 = '\0';
        strcpy(pcVar27 + -0x102,(char *)pnVar12);
        uVar17 = uVar17 + 1;
        lVar31 = lVar31 + 0x10;
        lVar19 = lVar19 + 0x10c;
        pnVar29 = local_1ef0;
      } while (lVar32 < (local_1ef0->field_4).e.numchoices);
    }
    pwVar10 = (wchar_t *)malloc((uVar17 & 0xffffffff) << 2);
    wVar7 = curses_display_menu(pnVar11,(wchar_t)uVar17,pnVar29->name,L'\x01',pwVar10);
    free(pnVar11);
    iVar5 = (pnVar29->value).i;
    if (wVar7 == L'\x01') {
      iVar5 = (pnVar29->field_4).e.choices[(long)*pwVar10 + -1].id;
    }
    local_1ee0 = (char *)CONCAT44(local_1ee0._4_4_,iVar5);
    free(pwVar10);
    break;
  case 3:
    local_1ef8 = (nh_menuitem_conflict *)lVar19;
    sprintf((char *)&local_1e68,"New value for %s (text)",pnVar29->name);
    curses_getline((char *)&local_1e68,local_1ee0);
    if (*local_1ee0 == '\x1b') {
      return '\0';
    }
    goto LAB_00110e81;
  case 4:
    plVar8 = (long *)malloc(0x10);
    *(undefined4 *)(plVar8 + 1) = 0;
    *plVar8 = 0;
    pnVar3 = (pnVar29->value).ar;
    if (pnVar3 != (nh_autopickup_rules *)0x0) {
      iVar5 = pnVar3->num_rules;
      *(int *)(plVar8 + 1) = iVar5;
      sVar30 = (size_t)(iVar5 * 0x34);
      pvVar9 = malloc(sVar30);
      *plVar8 = (long)pvVar9;
      memcpy(pvVar9,pnVar3->rules,sVar30);
    }
    uVar17 = (long)(int)plVar8[1] + 4;
    pnVar11 = (nh_menuitem_conflict *)malloc(uVar17 * 0x10c);
    local_1efc = L'\0';
    local_1ec8 = (char *)plVar8;
LAB_00110018:
    do {
      if ((int)uVar17 < 1) {
        uVar18 = (int)uVar17 * 2;
        uVar17 = (ulong)uVar18;
        pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
      }
      pnVar11->id = L'\0';
      pnVar11->role = MI_HEADING;
      pnVar11->accel = '\0';
      pnVar11->group_accel = '\0';
      pnVar11->selected = '\0';
      builtin_strncpy(pnVar11->caption,"Pos\tRule\tAction",0x10);
      if ((int)plVar8[1] < 1) {
        uVar26 = 1;
      }
      else {
        uVar26 = 1;
        uVar28 = 0;
        local_1ef8 = pnVar11;
        do {
          lVar31 = *plVar8;
          lVar32 = uVar28 * 0x34;
          lVar19 = lVar31 + lVar32;
          uVar28 = uVar28 + 1;
          sprintf(local_1d68,"%2d.\tIF ",uVar28 & 0xffffffff);
          cVar4 = *(char *)(lVar31 + lVar32);
          cVar34 = cVar4 != '\0';
          if ((bool)cVar34) {
            sVar30 = strlen(local_1d68);
            sprintf(local_1d68 + sVar30,"name matches \"%s\"",lVar19);
          }
          if (*(int *)(lVar19 + 0x28) != 0x61) {
            uVar14 = (ulong)(local_1ef0->field_4).e.numchoices;
            if ((long)uVar14 < 1) {
              pcVar27 = (char *)0x0;
            }
            else {
              ppcVar15 = &((local_1ef0->field_4).e.choices)->caption;
              uVar20 = 1;
              pcVar27 = (char *)0x0;
              do {
                if (((nh_listitem *)(ppcVar15 + -1))->id == *(int *)(lVar19 + 0x28)) {
                  pcVar27 = *ppcVar15;
                }
                if (uVar14 <= uVar20) break;
                uVar20 = uVar20 + 1;
                ppcVar15 = ppcVar15 + 2;
              } while (pcVar27 == (char *)0x0);
            }
            if (cVar4 != '\0') {
              sVar30 = strlen(local_1d68);
              builtin_strncpy(local_1d68 + sVar30," AND",4);
              *(undefined2 *)((long)auStack_1d64 + sVar30) = 0x20;
            }
            cVar34 = cVar34 + '\x01';
            sVar30 = strlen(local_1d68);
            sprintf(local_1d68 + sVar30,"type is \"%s\"",pcVar27);
          }
          plVar8 = (long *)local_1ec8;
          uVar18 = *(uint *)(lVar19 + 0x2c);
          if ((ulong)uVar18 != 4) {
            if (cVar34 != '\0') {
              sVar30 = strlen(local_1d68);
              builtin_strncpy(local_1d68 + sVar30," AND",4);
              *(undefined2 *)((long)auStack_1d64 + sVar30) = 0x20;
            }
            sVar30 = strlen(local_1d68);
            sprintf(local_1d68 + sVar30,"beatitude is %s",bucnames[uVar18]);
            cVar34 = '\x01';
          }
          if (cVar34 == '\0') {
            sprintf(local_1d68,"%2d.\teverything",uVar28 & 0xffffffff);
          }
          iVar5 = *(int *)(lVar19 + 0x30);
          sVar30 = strlen(local_1d68);
          if (iVar5 == 0) {
            builtin_strncpy(local_1d68 + sVar30,":\t< GRAB",8);
            *(undefined1 *)((long)auStack_1d60 + sVar30) = 0;
          }
          else {
            builtin_strncpy(local_1d68 + sVar30,":\t  LEAV",8);
            *(undefined4 *)((long)auStack_1d60 + sVar30) = 0x3e2045;
          }
          if ((long)(int)uVar17 <= (long)uVar26) {
            uVar18 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar18;
            local_1ef8 = (nh_menuitem_conflict *)realloc(local_1ef8,(long)(int)uVar18 * 0x10c);
          }
          pnVar11 = local_1ef8 + uVar26;
          pnVar11->id = (wchar_t)uVar28;
          pnVar11->role = MI_NORMAL;
          pnVar11->accel = '\0';
          pnVar11->group_accel = '\0';
          pnVar11->selected = '\0';
          strcpy(pnVar11->caption,local_1d68);
          uVar26 = uVar26 + 1;
          pnVar11 = local_1ef8;
        } while ((long)uVar28 < (long)(int)*(long *)((char *)plVar8 + 1));
      }
      iVar5 = (int)uVar26;
      if ((int)uVar17 <= iVar5) {
        uVar18 = (int)uVar17 * 2;
        uVar17 = (ulong)uVar18;
        pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
      }
      uVar26 = uVar26 & 0xffffffff;
      pnVar11[uVar26].accel = '\0';
      pnVar11[uVar26].group_accel = '\0';
      pnVar11[uVar26].selected = '\0';
      uVar18 = iVar5 + 1;
      pnVar11[uVar26].caption[0] = '\0';
      pnVar11[uVar26].id = L'\0';
      pnVar11[uVar26].role = MI_TEXT;
      if ((int)uVar17 <= (int)uVar18) {
        uVar13 = (int)uVar17 * 2;
        uVar17 = (ulong)uVar13;
        pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar13 * 0x10c);
      }
      pnVar11[uVar18].id = L'\xffffffff';
      pnVar11[uVar18].role = MI_NORMAL;
      pnVar11[uVar18].accel = '!';
      pnVar11[uVar18].group_accel = '\0';
      pnVar11[uVar18].selected = '\0';
      builtin_strncpy(pnVar11[uVar18].caption,"add a ne",8);
      builtin_strncpy(pnVar11[uVar18].caption + 7,"ew rule",8);
      uVar18 = iVar5 + 2;
      if ((int)uVar17 <= (int)uVar18) {
        uVar13 = (int)uVar17 * 2;
        uVar17 = (ulong)uVar13;
        pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar13 * 0x10c);
      }
      pnVar11[uVar18].id = L'\xfffffffe';
      pnVar11[uVar18].role = MI_NORMAL;
      pnVar11[uVar18].accel = '?';
      pnVar11[uVar18].group_accel = '\0';
      pnVar11[uVar18].selected = '\0';
      pnVar11[uVar18].caption[4] = '\0';
      builtin_strncpy(pnVar11[uVar18].caption,"help",4);
      local_1ef8 = pnVar11;
      if (local_1efc == L'\xffffffff') {
        wVar7 = curses_display_menu_bottom
                          (pnVar11,iVar5 + L'\x03',"Autopickup rules:",L'\x01',&local_1efc);
      }
      else {
        wVar7 = curses_display_menu(pnVar11,iVar5 + L'\x03',"Autopickup rules:",L'\x01',&local_1efc)
        ;
      }
      if (wVar7 < L'\x01') {
        nh_set_option(local_1ef0->name,plVar8,0);
        free((void *)*plVar8);
        free(plVar8);
        free(local_1ef8);
        return '\0';
      }
      if (local_1efc != L'\xfffffffe') {
        if (local_1efc == L'\xffffffff') {
          uVar26 = (ulong)(int)plVar8[1];
          iVar5 = (int)plVar8[1] + 1;
          *(int *)(plVar8 + 1) = iVar5;
          pvVar9 = realloc((void *)*plVar8,(long)(iVar5 * 0x34));
          *plVar8 = (long)pvVar9;
          lVar19 = uVar26 * 0x34;
          *(undefined1 *)((long)pvVar9 + lVar19) = 0;
          *(undefined8 *)((long)pvVar9 + lVar19 + 0x28) = 0x400000061;
          *(undefined4 *)((long)pvVar9 + lVar19 + 0x30) = 0;
        }
        else {
          uVar26 = (ulong)(uint)(local_1efc + L'\xffffffff');
        }
        iVar5 = (int)uVar26;
        local_1e90 = (long)iVar5 * 0x34;
        pcVar27 = (char *)(*plVar8 + local_1e90);
        local_1ea8 = uVar26;
        local_1ee8 = (nh_menuitem_conflict *)malloc(0x754);
        local_1eb8 = (nh_menuitem_conflict *)CONCAT44(local_1eb8._4_4_,iVar5 + 1);
        local_1ea0 = local_1ee8->caption;
        local_1ed0 = local_1ee8[1].caption;
        local_1ec0 = local_1ee8[2].caption;
        local_1e70 = local_1ee8[3].caption;
        local_1e78 = local_1ee8[4].caption;
        local_1e80 = local_1ee8 + 5;
        local_1e88 = local_1ee8[6].caption;
        local_1eb0 = (long)iVar5;
        do {
          sprintf(local_1c68,"rule position:\t[%d]",(ulong)local_1eb8 & 0xffffffff);
          pnVar11 = local_1ee8;
          pnVar11->id = L'\x01';
          pnVar11->role = MI_NORMAL;
          pnVar11->accel = '\0';
          pnVar11->group_accel = '\0';
          local_1ee8->selected = '\0';
          strcpy(local_1ea0,local_1c68);
          sprintf(local_1c68,"name pattern:\t[%s]",pcVar27);
          pnVar11[1].id = L'\x02';
          pnVar11[1].role = MI_NORMAL;
          pnVar11[1].accel = '\0';
          pnVar11[1].group_accel = '\0';
          pnVar11[1].selected = '\0';
          strcpy(local_1ed0,local_1c68);
          uVar26 = (ulong)(local_1ef0->field_4).e.numchoices;
          if ((long)uVar26 < 1) {
            pcVar24 = (char *)0x0;
          }
          else {
            ppcVar15 = &((local_1ef0->field_4).e.choices)->caption;
            uVar28 = 1;
            pcVar24 = (char *)0x0;
            do {
              if (((nh_listitem *)(ppcVar15 + -1))->id == *(int *)(pcVar27 + 0x28)) {
                pcVar24 = *ppcVar15;
              }
              if (uVar26 <= uVar28) break;
              uVar28 = uVar28 + 1;
              ppcVar15 = ppcVar15 + 2;
            } while (pcVar24 == (char *)0x0);
          }
          sprintf(local_1c68,"object type:\t[%s]",pcVar24);
          pnVar11 = local_1ee8;
          pnVar11[2].id = L'\x03';
          pnVar11[2].role = MI_NORMAL;
          pnVar11[2].accel = '\0';
          pnVar11[2].group_accel = '\0';
          local_1ee8[2].selected = '\0';
          strcpy(local_1ec0,local_1c68);
          sprintf(local_1c68,"beatitude:\t[%s]",bucnames[*(uint *)(pcVar27 + 0x2c)]);
          pnVar11[3].id = L'\x04';
          pnVar11[3].role = MI_NORMAL;
          pnVar11[3].accel = '\0';
          pnVar11[3].group_accel = '\0';
          pnVar11[3].selected = '\0';
          strcpy(local_1e70,local_1c68);
          pcVar24 = "LEAVE";
          if (*(int *)(pcVar27 + 0x30) == 0) {
            pcVar24 = "GRAB";
          }
          sprintf(local_1c68,"action:\t[%s]",pcVar24);
          pnVar11[4].id = L'\x05';
          pnVar11[4].role = MI_NORMAL;
          pnVar11[4].accel = '\0';
          pnVar11[4].group_accel = '\0';
          pnVar11[4].selected = '\0';
          strcpy(local_1e78,local_1c68);
          pnVar11[5].accel = '\0';
          pnVar11[5].group_accel = '\0';
          pnVar11[5].selected = '\0';
          local_1e80->caption[0] = '\0';
          local_1e80->id = L'\0';
          local_1e80->role = MI_TEXT;
          pnVar11[6].id = L'\x06';
          pnVar11[6].role = MI_NORMAL;
          pnVar11[6].accel = 'x';
          pnVar11[6].group_accel = '\0';
          pnVar11[6].selected = '\0';
          builtin_strncpy(local_1e88,"delete this rule",0x11);
          wVar7 = curses_display_menu(pnVar11,L'\a',"Edit rule:",L'\x01',&local_1ed8);
          if (wVar7 < L'\x01') goto LAB_00110af4;
          switch(local_1ed8) {
          case L'\x01':
            sprintf((char *)&local_1e68,"New rule position: (1 - %d), currently: %d",
                    (ulong)*(uint *)(plVar8 + 1),(ulong)local_1eb8 & 0xffffffff);
            local_1c68[0] = '\0';
            curses_getline((char *)&local_1e68,local_1c68);
            if ((local_1c68[0] != '\0') && (local_1c68[0] != '\x1b')) {
              uVar18 = atoi(local_1c68);
              if (((int)uVar18 < 1) || ((int)plVar8[1] < (int)uVar18)) {
                curses_msgwin("Invalid rule position.");
              }
              else {
                uVar13 = uVar18 - 1;
                if (uVar13 != (uint)local_1ea8) {
                  lVar19 = *plVar8;
                  local_1a68[0].caption._40_4_ = *(undefined4 *)(lVar19 + 0x30 + local_1e90);
                  local_1a68[0]._0_8_ = *(undefined8 *)(lVar19 + local_1e90);
                  local_1a68[0].caption._0_8_ = ((undefined8 *)(lVar19 + local_1e90))[1];
                  pcVar27 = (char *)(lVar19 + 0x10 + local_1e90);
                  local_1a68[0].caption._8_8_ = *(undefined8 *)pcVar27;
                  local_1a68[0].caption._16_8_ = *(undefined8 *)(pcVar27 + 8);
                  pcVar27 = (char *)(lVar19 + 0x20 + local_1e90);
                  local_1a68[0].caption._24_8_ = *(undefined8 *)pcVar27;
                  local_1a68[0].caption._32_8_ = *(undefined8 *)(pcVar27 + 8);
                  if ((int)(uint)local_1ea8 < (int)uVar13) {
                    lVar31 = (int)uVar13 - local_1eb0;
                    puVar16 = (undefined8 *)(local_1e90 + lVar19);
                    do {
                      *(undefined4 *)(puVar16 + 6) = *(undefined4 *)((long)puVar16 + 100);
                      puVar16[4] = *(undefined8 *)((long)puVar16 + 0x54);
                      puVar16[5] = *(undefined8 *)((long)puVar16 + 0x5c);
                      puVar16[2] = *(undefined8 *)((long)puVar16 + 0x44);
                      puVar16[3] = *(undefined8 *)((long)puVar16 + 0x4c);
                      *puVar16 = *(undefined8 *)((long)puVar16 + 0x34);
                      puVar16[1] = *(undefined8 *)((long)puVar16 + 0x3c);
                      puVar16 = (undefined8 *)((long)puVar16 + 0x34);
                      lVar31 = lVar31 + -1;
                    } while (lVar31 != 0);
                  }
                  else if ((int)uVar18 <= (int)(uint)local_1ea8) {
                    lVar31 = local_1eb0 + 1;
                    puVar16 = (undefined8 *)(local_1e90 + lVar19);
                    do {
                      *(undefined4 *)(puVar16 + 6) = *(undefined4 *)((long)puVar16 + -4);
                      puVar16[4] = *(undefined8 *)((long)puVar16 + -0x14);
                      puVar16[5] = *(undefined8 *)((long)puVar16 + -0xc);
                      puVar16[2] = *(undefined8 *)((long)puVar16 + -0x24);
                      puVar16[3] = *(undefined8 *)((long)puVar16 + -0x1c);
                      *puVar16 = *(undefined8 *)((long)puVar16 + -0x34);
                      puVar16[1] = *(undefined8 *)((long)puVar16 + -0x2c);
                      puVar16 = (undefined8 *)((long)puVar16 + -0x34);
                      lVar31 = lVar31 + -1;
                    } while ((long)(ulong)uVar18 < lVar31);
                  }
                  lVar31 = (ulong)uVar13 * 0x34;
                  *(undefined4 *)(lVar19 + 0x30 + lVar31) = local_1a68[0].caption._40_4_;
                  pcVar27 = (char *)(lVar19 + 0x20 + lVar31);
                  *(undefined8 *)pcVar27 = local_1a68[0].caption._24_8_;
                  *(undefined8 *)(pcVar27 + 8) = local_1a68[0].caption._32_8_;
                  pcVar27 = (char *)(lVar19 + 0x10 + lVar31);
                  *(undefined8 *)pcVar27 = local_1a68[0].caption._8_8_;
                  *(undefined8 *)(pcVar27 + 8) = local_1a68[0].caption._16_8_;
                  *(undefined8 *)(lVar19 + lVar31) = local_1a68[0]._0_8_;
                  ((undefined8 *)(lVar19 + lVar31))[1] = local_1a68[0].caption._0_8_;
                  goto LAB_00110af4;
                }
              }
            }
            break;
          case L'\x02':
            builtin_strncpy(acStack_1e60 + 0x18,"everything):",0xd);
            builtin_strncpy(acStack_1e60 + 8," (empty matches ",0x10);
            local_1e68._0_1_ = 'N';
            local_1e68._1_1_ = 'e';
            local_1e68._2_1_ = 'w';
            local_1e68._3_1_ = ' ';
            local_1e68._4_1_ = 'n';
            local_1e68._5_1_ = 'a';
            local_1e68._6_1_ = 'm';
            local_1e68._7_1_ = 'e';
            builtin_strncpy(acStack_1e60," pattern",8);
            local_1c68[0] = '\0';
            curses_getline((char *)&local_1e68,local_1c68);
            if (local_1c68[0] != '\x1b') {
              strncpy(pcVar27,local_1c68,0x28);
            }
            pcVar27[0x27] = '\0';
            break;
          case L'\x03':
            local_1e94 = *(wchar_t *)(pcVar27 + 0x28);
            uVar26 = (ulong)(local_1ef0->field_4).e.numchoices;
            pnVar11 = (nh_menuitem_conflict *)malloc(uVar26 * 0x10c);
            if ((long)uVar26 < 1) {
              lVar19 = 0;
            }
            else {
              lVar31 = 8;
              lVar32 = 0x10a;
              lVar19 = 0;
              do {
                if ((int)uVar26 <= lVar19) {
                  uVar18 = (int)uVar26 * 2;
                  uVar26 = (ulong)uVar18;
                  pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
                }
                pnVar29 = local_1ef0;
                pnVar2 = (local_1ef0->field_4).e.choices;
                uVar1 = *(undefined4 *)((long)pnVar2 + lVar31 + -8);
                *(undefined4 *)((long)pnVar11 + lVar32 + -0x10a) = uVar1;
                *(undefined4 *)((long)pnVar11 + lVar32 + -0x106) = 1;
                pnVar11->caption[lVar32 + -10] = (char)uVar1;
                (pnVar11->caption + lVar32 + -9)[0] = '\0';
                (pnVar11->caption + lVar32 + -9)[1] = '\0';
                strcpy((char *)((long)pnVar11 + lVar32 + -0x102),
                       *(char **)((long)&pnVar2->id + lVar31));
                lVar19 = lVar19 + 1;
                lVar31 = lVar31 + 0x10;
                lVar32 = lVar32 + 0x10c;
              } while (lVar19 < (pnVar29->field_4).e.numchoices);
            }
            wVar6 = curses_display_menu(pnVar11,(wchar_t)lVar19,"Object class match:",L'\x01',
                                        &local_1a68[0].id);
            free(pnVar11);
            wVar7 = local_1e94;
            if (L'\0' < wVar6) {
              wVar7 = local_1a68[0].id;
            }
            *(wchar_t *)(pcVar27 + 0x28) = wVar7;
            plVar8 = (long *)local_1ec8;
            break;
          case L'\x04':
            iVar5 = *(int *)(pcVar27 + 0x2c);
            memcpy(local_1a68,&DAT_0011bf60,0x53c);
            wVar7 = curses_display_menu(local_1a68,L'\x05',"Beatitude match:",L'\x01',&local_1ed4);
            iVar23 = local_1ed4 + L'\xffffffff';
            if (wVar7 < L'\x01') {
              iVar23 = iVar5;
            }
            *(int *)(pcVar27 + 0x2c) = iVar23;
            break;
          case L'\x05':
            if (*(int *)(pcVar27 + 0x30) == 0) {
              pcVar27[0x30] = '\x01';
              pcVar27[0x31] = '\0';
              pcVar27[0x32] = '\0';
              pcVar27[0x33] = '\0';
            }
            else {
              pcVar27[0x30] = '\0';
              pcVar27[0x31] = '\0';
              pcVar27[0x32] = '\0';
              pcVar27[0x33] = '\0';
            }
            break;
          case L'\x06':
            goto switchD_00110791_caseD_6;
          }
        } while( true );
      }
      memcpy(local_1a68,&DAT_0011a530,0x1a2c);
      curses_display_menu(local_1a68,L'\x19',"Autopickup rules help:",L'\0',(wchar_t *)0x0);
      pnVar11 = local_1ef8;
    } while( true );
  case 5:
    plVar8 = (long *)malloc(0x10);
    pnVar3 = (pnVar29->value).ar;
    if (pnVar3 == (nh_autopickup_rules *)0x0) {
      *(undefined4 *)(plVar8 + 1) = 0;
      *plVar8 = 0;
    }
    else {
      iVar5 = pnVar3->num_rules;
      *(int *)(plVar8 + 1) = iVar5;
      uVar17 = (ulong)(uint)(iVar5 * 0x7c);
      pvVar9 = malloc(uVar17);
      *plVar8 = (long)pvVar9;
      memcpy(pvVar9,pnVar3->rules,uVar17);
    }
    uVar17 = (long)(int)plVar8[1] + 4;
    pnVar11 = (nh_menuitem_conflict *)malloc(uVar17 * 0x10c);
    local_1efc = L'\0';
    do {
      while( true ) {
        while( true ) {
          if ((int)uVar17 < 1) {
            uVar18 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar18;
            pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
          }
          pnVar11->id = L'\0';
          pnVar11->role = MI_HEADING;
          pnVar11->accel = '\0';
          pnVar11->group_accel = '\0';
          pnVar11->selected = '\0';
          builtin_strncpy(pnVar11->caption,"Pos\tAction\tPattern",0x13);
          if ((int)plVar8[1] < 1) {
            uVar26 = 1;
          }
          else {
            lVar31 = 0x216;
            lVar19 = 0;
            uVar28 = 1;
            do {
              uVar18 = *(uint *)(*plVar8 + 0x78 + lVar19);
              if ((ulong)uVar18 < 3) {
                pcVar27 = (&PTR_anon_var_dwarf_af8b_00123b18)[uVar18];
              }
              else {
                pcVar27 = "(invalid)";
                if (uVar18 == 3) {
                  pcVar27 = "HIDE";
                }
              }
              sprintf((char *)local_1a68,"%2d.\t%s\t%s",uVar28 & 0xffffffff,pcVar27,*plVar8 + lVar19
                     );
              if ((long)(int)uVar17 <= (long)uVar28) {
                uVar18 = (int)uVar17 * 2;
                uVar17 = (ulong)uVar18;
                pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
              }
              pcVar27 = pnVar11->caption + lVar31 + -8;
              *(int *)(pcVar27 + -0x10a) = (int)uVar28;
              *(undefined4 *)(pcVar27 + -0x106) = 1;
              *(undefined2 *)(pcVar27 + -2) = MI_TEXT >> 0x10;
              *pcVar27 = '\0';
              strcpy(pcVar27 + -0x102,(char *)local_1a68);
              uVar26 = uVar28 + 1;
              lVar19 = lVar19 + 0x7c;
              lVar31 = lVar31 + 0x10c;
              bVar33 = (long)uVar28 < (long)(int)plVar8[1];
              uVar28 = uVar26;
              pnVar29 = local_1ef0;
            } while (bVar33);
          }
          iVar5 = (int)uVar26;
          if ((int)uVar17 <= iVar5) {
            uVar18 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar18;
            pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar18 * 0x10c);
          }
          uVar26 = uVar26 & 0xffffffff;
          pnVar11[uVar26].accel = '\0';
          pnVar11[uVar26].group_accel = '\0';
          pnVar11[uVar26].selected = '\0';
          uVar18 = iVar5 + 1;
          pnVar11[uVar26].caption[0] = '\0';
          pnVar11[uVar26].id = L'\0';
          pnVar11[uVar26].role = MI_TEXT;
          if ((int)uVar17 <= (int)uVar18) {
            uVar13 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar13;
            pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar13 * 0x10c);
          }
          pnVar11[uVar18].id = L'\xffffffff';
          pnVar11[uVar18].role = MI_NORMAL;
          pnVar11[uVar18].accel = '+';
          pnVar11[uVar18].group_accel = '\0';
          pnVar11[uVar18].selected = '\0';
          builtin_strncpy(pnVar11[uVar18].caption,"add new ",8);
          builtin_strncpy(pnVar11[uVar18].caption + 6,"w match",8);
          uVar18 = iVar5 + 2;
          if ((int)uVar17 <= (int)uVar18) {
            uVar13 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar13;
            pnVar11 = (nh_menuitem_conflict *)realloc(pnVar11,(long)(int)uVar13 * 0x10c);
          }
          pnVar11[uVar18].id = L'\xfffffffe';
          pnVar11[uVar18].role = MI_NORMAL;
          pnVar11[uVar18].accel = '?';
          pnVar11[uVar18].group_accel = '\0';
          pnVar11[uVar18].selected = '\0';
          pnVar11[uVar18].caption[4] = '\0';
          builtin_strncpy(pnVar11[uVar18].caption,"help",4);
          if (local_1efc == L'\xffffffff') {
            wVar7 = curses_display_menu_bottom
                              (pnVar11,iVar5 + L'\x03',"Message types:",L'\x01',&local_1efc);
          }
          else {
            wVar7 = curses_display_menu(pnVar11,iVar5 + L'\x03',"Message types:",L'\x01',&local_1efc
                                       );
          }
          wVar6 = local_1efc;
          if (wVar7 < L'\x01') {
            nh_set_option(pnVar29->name,plVar8,0);
            if ((void *)*plVar8 != (void *)0x0) {
              free((void *)*plVar8);
            }
            free(plVar8);
            free(pnVar11);
            return '\0';
          }
          uVar26 = (ulong)(uint)local_1efc;
          if (local_1efc != L'\xffffffff') break;
          iVar5 = (int)plVar8[1];
          if ((long)iVar5 < 1000) {
            *(int *)(plVar8 + 1) = iVar5 + 1;
            pvVar9 = realloc((void *)*plVar8,(ulong)(uint)((iVar5 + 1) * 0x7c));
            *plVar8 = (long)pvVar9;
            lVar19 = (long)iVar5 * 0x7c;
            *(undefined1 *)((long)pvVar9 + lVar19) = 0;
            *(undefined4 *)((long)pvVar9 + lVar19 + 0x78) = 0;
            pnVar29 = local_1ef0;
          }
          else {
            curses_msgwin("Maximum number of rules reached.");
            pnVar29 = local_1ef0;
          }
        }
        if (local_1efc != L'\xfffffffe') break;
        memcpy(local_1a68,&DAT_0011c4a0,0x10c0);
        curses_display_menu(local_1a68,L'\x10',"Message types help:",L'\0',(wchar_t *)0x0);
      }
      local_1ed0 = (char *)(long)(local_1efc + L'\xffffffff');
      local_1ec0 = (char *)((long)local_1ed0 * 0x7c);
      pcVar27 = local_1ec0 + *plVar8;
      pnVar12 = (nh_menuitem_conflict *)malloc(0x53c);
      local_1ef8 = (nh_menuitem_conflict *)pnVar12->caption;
      local_1ee8 = (nh_menuitem_conflict *)pnVar12[1].caption;
      local_1ec8 = pnVar12[2].caption;
      local_1eb8 = pnVar12 + 3;
      local_1ea0 = pnVar12[4].caption;
LAB_0011128d:
      sprintf((char *)&local_1e68,"Position:\t[%d]",uVar26);
      pnVar12->id = L'\x01';
      pnVar12->role = MI_NORMAL;
      pnVar12->accel = '\0';
      pnVar12->group_accel = '\0';
      pnVar12->selected = '\0';
      strcpy((char *)local_1ef8,(char *)&local_1e68);
      uVar18 = *(uint *)(pcVar27 + 0x78);
      if ((ulong)uVar18 < 3) {
        pcVar24 = (&PTR_anon_var_dwarf_af8b_00123b18)[uVar18];
      }
      else {
        pcVar24 = "(invalid)";
        if (uVar18 == 3) {
          pcVar24 = "HIDE";
        }
      }
      sprintf((char *)&local_1e68,"Action:\t[%s]",pcVar24);
      pnVar12[1].id = L'\x02';
      pnVar12[1].role = MI_NORMAL;
      pnVar12[1].accel = '\0';
      pnVar12[1].group_accel = '\0';
      pnVar12[1].selected = '\0';
      strcpy((char *)local_1ee8,(char *)&local_1e68);
      sprintf((char *)&local_1e68,"Pattern:\t[%s]",pcVar27);
      pnVar12[2].id = L'\x03';
      pnVar12[2].role = MI_NORMAL;
      pnVar12[2].accel = '\0';
      pnVar12[2].group_accel = '\0';
      pnVar12[2].selected = '\0';
      strcpy(local_1ec8,(char *)&local_1e68);
      pnVar12[3].accel = '\0';
      pnVar12[3].group_accel = '\0';
      pnVar12[3].selected = '\0';
      local_1eb8->caption[0] = '\0';
      local_1eb8->id = L'\0';
      local_1eb8->role = MI_TEXT;
      pnVar12[4].id = L'\x04';
      pnVar12[4].role = MI_NORMAL;
      pnVar12[4].accel = '!';
      pnVar12[4].group_accel = '\0';
      pnVar12[4].selected = '\0';
      builtin_strncpy(local_1ea0,"Delete this match",0x12);
      wVar7 = curses_display_menu(pnVar12,L'\x05',"Edit match:",L'\x01',&local_1ed8);
      if (wVar7 < L'\x01') goto LAB_001116d3;
      switch(local_1ed8) {
      case L'\x01':
        sprintf(local_1c68,"New match position: (1 - %d, currently %d)",(ulong)*(uint *)(plVar8 + 1)
                ,uVar26);
        local_1e68 = local_1e68 & 0xffffffffffffff00;
        curses_getline(local_1c68,(char *)&local_1e68);
        if (((char)local_1e68 == '\0') || ((char)local_1e68 == '\x1b')) goto LAB_0011128d;
        wVar7 = atoi((char *)&local_1e68);
        if ((wVar7 < L'\x01') || (*(wchar_t *)(plVar8 + 1) < wVar7)) {
          pcVar24 = "Invalid match position.";
          goto LAB_0011156b;
        }
        if (wVar7 == wVar6) goto LAB_0011128d;
        lVar19 = *plVar8;
        pcVar27 = local_1ec0 + lVar19;
        pnVar22 = local_1a68;
        for (lVar31 = 0x1f; lVar31 != 0; lVar31 = lVar31 + -1) {
          pnVar22->id = *(wchar_t *)pcVar27;
          pcVar27 = pcVar27 + (ulong)bVar35 * -8 + 4;
          pnVar22 = (nh_menuitem_conflict *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
        }
        if (wVar6 < wVar7) {
          lVar31 = (long)(wVar7 + L'\xffffffff') - (long)local_1ed0;
          pcVar27 = local_1ec0 + lVar19;
          do {
            pcVar24 = pcVar27 + 0x7c;
            pcVar21 = pcVar27;
            for (lVar32 = 0x1f; lVar32 != 0; lVar32 = lVar32 + -1) {
              *(undefined4 *)pcVar21 = *(undefined4 *)pcVar24;
              pcVar24 = pcVar24 + (ulong)bVar35 * -8 + 4;
              pcVar21 = pcVar21 + (ulong)bVar35 * -8 + 4;
            }
            lVar31 = lVar31 + -1;
            pcVar27 = pcVar27 + 0x7c;
          } while (lVar31 != 0);
        }
        else if (wVar7 < wVar6) {
          pcVar24 = local_1ed0 + 1;
          pcVar27 = local_1ec0 + lVar19;
          do {
            pcVar21 = pcVar27 + -0x7c;
            pcVar25 = pcVar27;
            for (lVar31 = 0x1f; lVar31 != 0; lVar31 = lVar31 + -1) {
              *(wchar_t *)pcVar25 = *(wchar_t *)pcVar21;
              pcVar21 = pcVar21 + (ulong)bVar35 * -8 + 4;
              pcVar25 = pcVar25 + (ulong)bVar35 * -8 + 4;
            }
            pcVar24 = pcVar24 + -1;
            pcVar27 = pcVar27 + -0x7c;
          } while ((long)(ulong)(uint)wVar7 < (long)pcVar24);
        }
        pnVar22 = local_1a68;
        pwVar10 = (wchar_t *)(lVar19 + (ulong)(uint)(wVar7 + L'\xffffffff') * 0x7c);
        for (lVar31 = 0x1f; lVar31 != 0; lVar31 = lVar31 + -1) {
          *pwVar10 = pnVar22->id;
          pnVar22 = (nh_menuitem_conflict *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          pwVar10 = pwVar10 + (ulong)bVar35 * -2 + 1;
        }
LAB_001116d3:
        pnVar29 = local_1ef0;
        free(pnVar12);
        break;
      case L'\x02':
        uVar18 = *(uint *)(pcVar27 + 0x78);
        memcpy(local_1a68,&DAT_0011d560,0x430);
        if ((ulong)uVar18 < 3) {
          pcVar24 = (&PTR_anon_var_dwarf_af8b_00123b18)[uVar18];
        }
        else {
          pcVar24 = "(invalid)";
          if (uVar18 == 3) {
            pcVar24 = "HIDE";
          }
        }
        sprintf(local_1d68,"Message type action: (currently %s)",pcVar24);
        wVar7 = curses_display_menu(local_1a68,L'\x04',local_1d68,L'\x01',&local_1ed4);
        uVar13 = local_1ed4 + L'\xffffffff';
        if (wVar7 < L'\x01') {
          uVar13 = uVar18;
        }
        *(uint *)(pcVar27 + 0x78) = uVar13;
        goto LAB_0011128d;
      case L'\x03':
        snprintf(local_1c68,0x100,"New match pattern: (currently \"%s\")",pcVar27);
        local_1e68 = local_1e68 & 0xffffffffffffff00;
        curses_getline(local_1c68,(char *)&local_1e68);
        if ((char)local_1e68 != '\x1b') {
          lVar19 = 0;
          do {
            cVar4 = *(char *)((long)&local_1e68 + lVar19);
            if (((cVar4 == '\"') || (cVar4 == '|')) || (cVar4 == ';')) {
              *(undefined1 *)((long)&local_1e68 + lVar19) = 0x3f;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x100);
          strncpy(pcVar27,(char *)&local_1e68,0x78);
        }
        pcVar27[0x77] = '\0';
        goto LAB_0011128d;
      case L'\x04':
        lVar19 = (long)*(wchar_t *)(plVar8 + 1) + -1;
        if (wVar6 < *(wchar_t *)(plVar8 + 1)) {
          pcVar27 = local_1ec0 + *plVar8;
          pcVar24 = local_1ed0;
          do {
            pcVar24 = pcVar24 + 1;
            pcVar21 = pcVar27 + 0x7c;
            pcVar25 = pcVar27;
            for (lVar31 = 0x1f; lVar31 != 0; lVar31 = lVar31 + -1) {
              *(undefined4 *)pcVar25 = *(undefined4 *)pcVar21;
              pcVar21 = pcVar21 + (ulong)bVar35 * -8 + 4;
              pcVar25 = pcVar25 + (ulong)bVar35 * -8 + 4;
            }
            pcVar27 = pcVar27 + 0x7c;
          } while ((long)pcVar24 < lVar19);
        }
        iVar5 = (int)lVar19;
        *(int *)(plVar8 + 1) = iVar5;
        pvVar9 = realloc((void *)*plVar8,(long)iVar5 * 0x7c);
        *plVar8 = (long)pvVar9;
        goto LAB_001116d3;
      default:
        pcVar24 = "Invalid msgtype match menu choice.";
LAB_0011156b:
        curses_msgwin(pcVar24);
        goto LAB_0011128d;
      }
    } while( true );
  }
  iVar5 = (int)local_1ee8;
LAB_00110e81:
  cVar4 = nh_set_option(pnVar29->name,local_1ee0,0);
  if (cVar4 == '\0') {
    sprintf(local_1b68,"new value for %s rejected",pnVar29->name);
    curses_msgwin(local_1b68);
  }
  else {
    print_option_string(pnVar29,mdat->items->caption + (long)local_1ef8);
  }
  return settings.optstyle != iVar5;
switchD_00110791_caseD_6:
  lVar19 = (long)(int)plVar8[1] + -1;
  iVar5 = (int)lVar19;
  if ((int)(uint)local_1ea8 < iVar5) {
    puVar16 = (undefined8 *)(local_1e90 + *plVar8);
    lVar31 = local_1eb0;
    do {
      lVar31 = lVar31 + 1;
      *(undefined4 *)(puVar16 + 6) = *(undefined4 *)((long)puVar16 + 100);
      puVar16[4] = *(undefined8 *)((long)puVar16 + 0x54);
      puVar16[5] = *(undefined8 *)((long)puVar16 + 0x5c);
      puVar16[2] = *(undefined8 *)((long)puVar16 + 0x44);
      puVar16[3] = *(undefined8 *)((long)puVar16 + 0x4c);
      *puVar16 = *(undefined8 *)((long)puVar16 + 0x34);
      puVar16[1] = *(undefined8 *)((long)puVar16 + 0x3c);
      puVar16 = (undefined8 *)((long)puVar16 + 0x34);
    } while (lVar31 < lVar19);
  }
  *(int *)(plVar8 + 1) = iVar5;
  pvVar9 = realloc((void *)*plVar8,(long)iVar5 * 0x34);
  *plVar8 = (long)pvVar9;
LAB_00110af4:
  free(local_1ee8);
  pnVar11 = local_1ef8;
  goto LAB_00110018;
}

Assistant:

static nh_bool get_option_value(struct win_menu *mdat, int idx)
{
    char buf[BUFSZ], query[BUFSZ];
    union nh_optvalue value;
    struct nh_option_desc *option, *optlist;
    int listid = mdat->items[idx].id >> 10;
    int id = mdat->items[idx].id & 0x1ff;
    char strbuf[BUFSZ];
    int prev_optstyle = settings.optstyle;
    
    switch (listid) {
	case ACT_BIRTH_OPTS:
	    optlist = nh_get_options(ACTIVE_BIRTH_OPTIONS); break;
	case CUR_BIRTH_OPTS:
	    optlist = nh_get_options(CURRENT_BIRTH_OPTIONS); break;
	case GAME_OPTS:
	    optlist = nh_get_options(GAME_OPTIONS); break;
	case UI_OPTS:
	    optlist = curses_options; break;
	    
	default:
	    return FALSE;
    }
    
    option = &optlist[id];
    value.s = strbuf;
    
    switch ((int)option->type) {
	case OPTTYPE_BOOL:
	    select_boolean_value(&value, option);
	    break;
	    
	case OPTTYPE_INT:
	    sprintf(query, "New value for %s (number from %d to %d)",
		    option->name, option->i.min, option->i.max);
	    sprintf(buf, "%d", value.i);
	    curses_getline(query, buf);
	    if (buf[0] == '\033')
		return FALSE;
	    sscanf(buf, "%d", &value.i);
	    break;
	    
	case OPTTYPE_ENUM:
	    select_enum_value(&value, option);
	    break;
	    
	case OPTTYPE_STRING:
	    sprintf(query, "New value for %s (text)", option->name);
	    curses_getline(query, value.s);
	    if (value.s[0] == '\033')
		return FALSE;
	    break;
	    
	case OPTTYPE_AUTOPICKUP_RULES:
	    show_autopickup_menu(option);
	    return FALSE;
	    
	case OPTTYPE_MSGTYPE:
	    show_msgtype_menu(option);
	    return FALSE;
	    
	case OPTTYPE_KEYMAP:
	    show_keymap_menu(FALSE);
	    return FALSE;
	    
	default:
	    return FALSE;
    }
    
    if (!nh_set_option(option->name, value, FALSE)) {
	sprintf(strbuf, "new value for %s rejected", option->name);
	curses_msgwin(strbuf);
    } else
	print_option_string(option, mdat->items[idx].caption);
    
    /* special case: directly redo option menu appearance */
    if (settings.optstyle != prev_optstyle)
	return TRUE;
    
    return FALSE;
}